

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.cpp
# Opt level: O0

vm_obj_id_t CVmObjTads::create_from_stack_intern(uchar **pc_ptr,uint argc,int is_transient)

{
  int iVar1;
  vm_rcdesc *this;
  ulong uVar2;
  uchar *puVar3;
  vm_val_t *this_00;
  int in_EDX;
  int in_ESI;
  undefined8 *in_RDI;
  vm_rcdesc *rcp;
  vm_rcdesc rc;
  uint caller_ofs;
  uchar *dummy_pc_ptr;
  vm_val_t id_val;
  vm_val_t srcobj_val;
  vm_obj_id_t srcobj;
  vm_val_t val;
  CVmObjTads *obj;
  vm_obj_id_t id;
  char *in_stack_ffffffffffffff38;
  CVmObjTable *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  vm_val_t *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff84;
  vm_val_t *in_stack_ffffffffffffff88;
  vm_prop_id_t in_stack_ffffffffffffff96;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 uVar4;
  uint in_stack_ffffffffffffffa4;
  CVmRun *in_stack_ffffffffffffffa8;
  anon_union_8_8_cb74652f_for_val in_stack_ffffffffffffffc0;
  vm_obj_id_t local_34;
  vm_val_t local_30;
  vm_rcdesc *local_20;
  vm_obj_id_t local_14;
  int local_10;
  int local_c;
  undefined8 *local_8;
  
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  if (in_ESI == 0) {
    vm_val_t::set_nil(&local_30);
  }
  else {
    CVmStack::pop(&local_30);
    if ((local_30.typ != VM_OBJ) && (local_30.typ != VM_NIL)) {
      err_throw(0);
    }
    if ((local_30.typ == VM_OBJ) && (local_30.val.obj == 0)) {
      vm_val_t::set_nil(&local_30);
    }
    if ((local_30.typ != VM_NIL) &&
       (iVar1 = CVmObjTable::is_obj_transient
                          (in_stack_ffffffffffffff40,
                           (vm_obj_id_t)((ulong)in_stack_ffffffffffffff38 >> 0x20)), iVar1 != 0)) {
      err_throw(0);
    }
    local_c = local_c + -1;
  }
  local_14 = vm_new_id((int)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                       (int)in_stack_ffffffffffffff40,
                       (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
  if (local_10 != 0) {
    CVmObjTable::set_obj_transient
              (in_stack_ffffffffffffff40,(vm_obj_id_t)((ulong)in_stack_ffffffffffffff38 >> 0x20));
  }
  this = (vm_rcdesc *)
         CVmObject::operator_new
                   ((size_t)in_stack_ffffffffffffff40,
                    (vm_obj_id_t)((ulong)in_stack_ffffffffffffff38 >> 0x20));
  CVmObjTads((CVmObjTads *)this,(ushort)((ulong)in_stack_ffffffffffffff38 >> 0x30),
             (ushort)((ulong)in_stack_ffffffffffffff38 >> 0x20));
  local_20 = this;
  if (local_30.typ != VM_NIL) {
    set_sc((CVmObjTads *)in_stack_ffffffffffffff50,
           (ushort)((ulong)in_stack_ffffffffffffff48 >> 0x30),(vm_obj_id_t)in_stack_ffffffffffffff48
          );
  }
  iVar1 = (*((CVmObject *)&local_20->argp)->_vptr_CVmObject[0xd])
                    (local_20,(ulong)G_predef_X.obj_construct,&local_30,(ulong)local_14,&local_34,0)
  ;
  if (iVar1 == 0) {
    if (local_c != 0) {
      err_throw(0);
    }
    this_00 = CVmRun::get_r0();
    vm_val_t::set_obj(this_00,local_14);
  }
  else {
    vm_rcdesc::vm_rcdesc((vm_rcdesc *)&stack0xffffffffffffff50);
    if (local_8 == (undefined8 *)0x0) {
      local_8 = (undefined8 *)&stack0xffffffffffffffa0;
      uVar4 = 0;
      vm_rcdesc::init_ret(this,in_stack_ffffffffffffff38);
    }
    else {
      uVar2 = CVmRun::pc_to_method_ofs((uchar *)*local_8);
      uVar4 = (undefined4)uVar2;
    }
    vm_val_t::set_obj((vm_val_t *)&stack0xffffffffffffffb8,local_34);
    vm_val_t::set_obj((vm_val_t *)&stack0xffffffffffffffa8,local_14);
    puVar3 = CVmRun::get_prop(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,
                              (vm_val_t *)CONCAT44(uVar4,in_stack_ffffffffffffff98),
                              in_stack_ffffffffffffff96,in_stack_ffffffffffffff88,
                              in_stack_ffffffffffffff84,
                              (vm_rcdesc *)in_stack_ffffffffffffffc0.native_desc);
    *local_8 = puVar3;
  }
  return local_14;
}

Assistant:

vm_obj_id_t CVmObjTads::create_from_stack_intern(
    VMG_ const uchar **pc_ptr, uint argc, int is_transient)
{
    vm_obj_id_t id;
    CVmObjTads *obj;
    vm_val_t val;
    vm_obj_id_t srcobj;

    /* check arguments */
    if (argc == 0)
    {
        /* no superclass argument - create a base object */
        val.set_nil();
    }
    else
    {
        /* 
         *   We have arguments.  The first is the superclass argument, which
         *   must be an object or nil.  Retrieve it and make sure it's
         *   valid.  
         */
        G_stk->pop(&val);
        if (val.typ != VM_OBJ && val.typ != VM_NIL)
            err_throw(VMERR_OBJ_VAL_REQD_SC);

        /* if it's the invalid object, treat it as nil */
        if (val.typ == VM_OBJ && val.val.obj == VM_INVALID_OBJ)
            val.set_nil();

        /* we cannot create an instance of a transient object */
        if (val.typ != VM_NIL
            && G_obj_table->is_obj_transient(val.val.obj))
            err_throw(VMERR_BAD_DYNAMIC_NEW);

        /* count the removal of the first argument */
        --argc;
    }

    /* 
     *   create the object - this type of construction is never used for
     *   root set objects 
     */
    id = vm_new_id(vmg_ FALSE, TRUE, FALSE);

    /* make the object transient if desired */
    if (is_transient)
        G_obj_table->set_obj_transient(id);

    /* 
     *   create a TADS object with the appropriate number of superclasses
     *   (0 if no superclass was specified, 1 if one was), and the default
     *   number of initial mutable properties 
     */
    obj = new (vmg_ id) CVmObjTads(vmg_ (val.typ == VM_NIL ? 0 : 1),
                                   VMTOBJ_PROP_INIT);

    /* set the object's superclass */
    if (val.typ != VM_NIL)
        obj->set_sc(vmg_ 0, val.val.obj);

    /* 
     *   Invoke the object's "construct" method, passing it the arguments
     *   that are still on the stack.  If the new object doesn't define or
     *   inherit the "construct" method, simply push the new object
     *   reference onto the stack directly.  
     */
    if (obj->get_prop(vmg_ G_predef->obj_construct, &val, id, &srcobj, 0))
    {
        vm_val_t srcobj_val;
        vm_val_t id_val;
        const uchar *dummy_pc_ptr;
        uint caller_ofs;
        vm_rcdesc rc, *rcp;
        
        /* use the null PC pointer if the caller didn't supply one */
        if (pc_ptr == 0)
        {
            /* there's no caller PC pointer - use a dummy value */
            pc_ptr = &dummy_pc_ptr;
            caller_ofs = 0;

            /* set up the recursive context */
            rcp = &rc;
            rc.init_ret(vmg_ "TadsObject.construct");
        }
        else
        {
            /* get the caller's offset */
            caller_ofs = G_interpreter->pc_to_method_ofs(*pc_ptr);
            rcp = 0;
        }

        /* 
         *   A "construct" method is defined - have the interpreter invoke
         *   it, which will set up the interpreter to start executing its
         *   byte-code.  This is all we need to do, since we assume and
         *   require that the constructor will return the new object as
         *   its return value when it's done.  
         */
        srcobj_val.set_obj(srcobj);
        id_val.set_obj(id);
        *pc_ptr = G_interpreter->get_prop(vmg_ caller_ofs, &srcobj_val,
                                          G_predef->obj_construct,
                                          &id_val, argc, rcp);
    }
    else
    {
        /* 
         *   there's no "construct" method defined - if we have any
         *   arguments, its an error 
         */
        if (argc != 0)
            err_throw(VMERR_WRONG_NUM_OF_ARGS);

        /* leave the new object value in R0 */
        G_interpreter->get_r0()->set_obj(id);
    }

    /* return the new object */
    return id;
}